

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_bc6e::read_modern_mmap_range_prealloc(char *file_name)

{
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> in_RDI;
  mmap_file file;
  mmap_file mStack_58;
  char *local_40;
  path local_38;
  
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_38,&local_40,auto_format);
  io::posix::mmap_file::mmap_file(&mStack_58,&local_38,read_only,owner_read|owner_write);
  std::filesystem::__cxx11::path::~path(&local_38);
  ((in_RDI.container)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((in_RDI.container)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((in_RDI.container)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (in_RDI.container,mStack_58.mmap_.size_);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((uchar *)mStack_58.mmap_.addr_,
             (uchar *)((long)mStack_58.mmap_.addr_ + mStack_58.mmap_.size_),in_RDI);
  io::posix::detail::mmap_handle::~mmap_handle(&mStack_58.mmap_);
  return in_RDI.container;
}

Assistant:

std::vector<std::uint8_t> read_modern_mmap_range_prealloc(const char* file_name)
{
    auto file = io::posix::mmap_file{file_name, io::open_mode::read_only};
    std::vector<std::uint8_t> output;
    output.reserve(file.size());
    std::copy(std::begin(file), std::end(file), std::back_inserter(output));
    return output;
}